

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::SendAndClose(TCPSocket *this,string *str)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  Buffer::New((Buffer *)&stack0xffffffffffffffd8,str);
  SendAndClose(this,(Ptr *)&stack0xffffffffffffffd8,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

void TCPSocket::SendAndClose(const std::string &str) {
	this->SendAndClose(Buffer::New(str),0);
}